

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_test.cc
# Opt level: O0

string * gtest_AllBase64Test_EvalGenerateName__abi_cxx11_
                   (string *__return_storage_ptr__,TestParamInfo<Base64TestVector> *info)

{
  bool bVar1;
  ParamGenerator<Base64TestVector> local_38;
  undefined1 local_28 [8];
  tuple<testing::internal::ParamGenerator<Base64TestVector>_> t;
  TestParamInfo<Base64TestVector> *info_local;
  
  t.super__Tuple_impl<0UL,_testing::internal::ParamGenerator<Base64TestVector>_>.
  super__Head_base<0UL,_testing::internal::ParamGenerator<Base64TestVector>,_false>._M_head_impl.
  impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<Base64TestVector>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)info;
  bVar1 = testing::internal::AlwaysFalse();
  if (bVar1) {
    testing::internal::
    TestNotEmpty<std::__cxx11::string(testing::TestParamInfo<Base64TestVector>const&)>
              (testing::internal::DefaultParamName<Base64TestVector>);
    testing::ValuesIn<Base64TestVector,42ul>((testing *)&local_38,&kTestVectors);
    std::make_tuple<testing::internal::ParamGenerator<Base64TestVector>>
              ((ParamGenerator<Base64TestVector> *)local_28);
    testing::internal::ParamGenerator<Base64TestVector>::~ParamGenerator(&local_38);
    std::tuple<testing::internal::ParamGenerator<Base64TestVector>_>::~tuple
              ((tuple<testing::internal::ParamGenerator<Base64TestVector>_> *)local_28);
  }
  testing::internal::DefaultParamName<Base64TestVector>
            (__return_storage_ptr__,
             (TestParamInfo<Base64TestVector> *)
             t.super__Tuple_impl<0UL,_testing::internal::ParamGenerator<Base64TestVector>_>.
             super__Head_base<0UL,_testing::internal::ParamGenerator<Base64TestVector>,_false>.
             _M_head_impl.impl_.
             super___shared_ptr<const_testing::internal::ParamGeneratorInterface<Base64TestVector>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi);
  return __return_storage_ptr__;
}

Assistant:

static std::string RemoveNewlines(const char *in) {
  std::string ret;
  const size_t in_len = strlen(in);

  for (size_t i = 0; i < in_len; i++) {
    if (in[i] != '\n') {
      ret.push_back(in[i]);
    }
  }

  return ret;
}